

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow.c
# Opt level: O0

void borg_flow_spread(wchar_t depth,_Bool optimize,_Bool avoid,_Bool tunneling,wchar_t stair_idx,
                     _Bool sneak)

{
  byte bVar1;
  byte bVar2;
  short sVar3;
  short sVar4;
  bool bVar5;
  bool bVar6;
  chunk_conflict *pcVar7;
  _Bool _Var8;
  wchar_t wVar9;
  wchar_t wVar10;
  wchar_t y_00;
  wchar_t wVar11;
  loc_conflict lVar12;
  borg_grid *pbVar13;
  wchar_t p;
  borg_grid *ag;
  wchar_t old_head;
  int iStack_4c;
  _Bool twitchy;
  wchar_t origin_x;
  wchar_t origin_y;
  _Bool bad_sneak;
  wchar_t xx;
  wchar_t yy;
  wchar_t ii;
  wchar_t fear;
  wchar_t y;
  wchar_t x;
  wchar_t y1;
  wchar_t x1;
  wchar_t o;
  wchar_t n;
  wchar_t i;
  _Bool sneak_local;
  wchar_t stair_idx_local;
  _Bool tunneling_local;
  _Bool avoid_local;
  _Bool optimize_local;
  wchar_t depth_local;
  
  y1 = L'\0';
  yy = L'\0';
  iStack_4c = borg.c.y;
  old_head = borg.c.x;
  bVar5 = borg.trait[0x1b] < (int)avoidance;
  sneak_local = optimize;
  if ((L'\xffffffff' < stair_idx) && (borg.trait[0x23] < 0xf)) {
    iStack_4c = track_less.y[stair_idx];
    old_head = track_less.x[stair_idx];
    sneak_local = false;
  }
  do {
    if (flow_head == flow_tail) {
      flow_tail = L'\0';
      flow_head = L'\0';
      return;
    }
    bVar1 = borg_flow_x[flow_tail];
    bVar2 = borg_flow_y[flow_tail];
    flow_tail = flow_tail + L'\x01';
    if (flow_tail == L'؀') {
      flow_tail = L'\0';
    }
    wVar9 = (uint)borg_data_cost->data[(int)(uint)bVar2][(int)(uint)bVar1] + L'\x01';
    if ((uint)y1 < (uint)wVar9) {
      if (((sneak_local & 1U) != 0) &&
         ((uint)borg_data_cost->data[iStack_4c][old_head] < (uint)wVar9)) {
        flow_head = L'\0';
        flow_tail = L'\0';
        return;
      }
      y1 = wVar9;
      if (depth < wVar9) {
        flow_head = L'\0';
        flow_tail = L'\0';
        return;
      }
    }
    for (o = L'\0'; pcVar7 = cave, o < L'\b'; o = o + L'\x01') {
      bVar6 = false;
      wVar10 = (uint)bVar1 + (int)ddx_ddd[o];
      y_00 = (uint)bVar2 + (int)ddy_ddd[o];
      lVar12 = (loc_conflict)loc(wVar10,y_00);
      _Var8 = square_in_bounds_fully((chunk *)pcVar7,lVar12);
      if ((_Var8) && ((uint)wVar9 < (uint)borg_data_cost->data[y_00][wVar10])) {
        pbVar13 = borg_grids[y_00] + wVar10;
        if ((sneak) && (((borg_desperate & 1U) == 0 && (!bVar5)))) {
          for (xx = L'\0'; pcVar7 = cave, xx < L'\b'; xx = xx + L'\x01') {
            sVar3 = ddx_ddd[xx];
            sVar4 = ddy_ddd[xx];
            lVar12 = (loc_conflict)loc(wVar10 + sVar3,y_00 + sVar4);
            _Var8 = square_in_bounds_fully((chunk *)pcVar7,lVar12);
            if ((_Var8) && (borg_grids[y_00 + sVar4][wVar10 + sVar3].kill != '\0')) {
              bVar6 = true;
              break;
            }
          }
        }
        if ((((((((!bVar6) &&
                 (((((tunneling || (pbVar13->feat < 0xf)) || (pbVar13->feat == '\x18')) ||
                   (pbVar13->feat == '\x17')) && (pbVar13->feat != '\x16')))) &&
                ((pbVar13->feat != '\x17' || (borg.trait[0x40] != 0)))) &&
               (((!avoid && ((borg_desperate & 1U) == 0)) || ((pbVar13->feat != '\0' || (bVar5))))))
              && ((pbVar13->kill == '\0' ||
                  (((((borg_desperate & 1U) == 0 && ((borg.lunal_mode & 1U) == 0)) &&
                    ((borg.munchkin_mode & 1U) == 0)) &&
                   ((borg.trait[0x71] == 0 &&
                    (((bVar5 || (borg.trait[0x27] < 2)) || (4 < borg.trait[0x24])))))))))) &&
             (((borg.goal.shop < 0 || (_Var8 = feat_is_shop((uint)pbVar13->feat), !_Var8)) ||
              (((ushort)pbVar13->store == borg.goal.shop ||
               ((y_00 == borg.c.y || (wVar10 == borg.c.x)))))))) &&
            ((((pbVar13->trap & 1U) == 0 || (((pbVar13->glyph & 1U) != 0 || (bVar5)))) ||
             ((((0x3b < borg.trait[0x1b] && ((0x1d < borg.trait[0x36] || (0x13 < borg.trait[0x23])))
                ) && ((0x2c < borg.trait[0x36] || (9 < borg.trait[0x23])))) &&
              (((0x1d < borg.trait[0x37] || (0x13 < borg.trait[0x23])) &&
               ((0x2c < borg.trait[0x37] || (9 < borg.trait[0x23])))))))))) &&
           (borg_data_icky->data[y_00][wVar10] == '\0')) {
          if ((((borg_data_know->data[y_00][wVar10] == '\0') &&
               (borg_data_know->data[y_00][wVar10] = '\x01', (borg_desperate & 1U) == 0)) &&
              ((borg.lunal_mode & 1U) == 0)) &&
             (((borg.munchkin_mode & 1U) == 0 && ((borg_digging & 1U) == 0)))) {
            wVar11 = borg_danger(y_00,wVar10,L'\x01',true,false);
            if (borg.trait[0x24] == 0x32) {
              yy = (avoidance * 5) / 10;
            }
            if (borg.trait[0x24] != 0x32) {
              yy = (avoidance * 3) / 10;
            }
            if ((scaryguy_on_level & 1U) != 0) {
              yy = (int)avoidance << 1;
            }
            if (((unique_on_level != 0) && ((vault_on_level & 1U) != 0)) &&
               (borg.trait[0x24] == 0x32)) {
              yy = avoidance * 3;
            }
            if (((scaryguy_on_level & 1U) != 0) && (borg.trait[0x23] < 6)) {
              yy = avoidance * 3;
            }
            if ((borg.goal.ignoring & 1U) != 0) {
              yy = avoidance * 5;
            }
            if (5000 < borg_t - borg_began) {
              yy = avoidance * 0x19;
            }
            if (borg.trait[0x27] == 0) {
              yy = avoidance * 100;
            }
            if (borg.trait[0x23] == 0) {
              yy = (avoidance * 3) / 10;
            }
            if (yy < wVar11) {
              borg_data_icky->data[y_00][wVar10] = '\x01';
              goto LAB_002a29e9;
            }
          }
          borg_data_cost->data[y_00][wVar10] = (uint8_t)wVar9;
          borg_flow_x[flow_head] = (uint8_t)wVar10;
          borg_flow_y[flow_head] = (uint8_t)y_00;
          wVar10 = flow_head;
          flow_head = flow_head + L'\x01';
          if (flow_head == L'؀') {
            flow_head = L'\0';
          }
          if (flow_head == flow_tail) {
            flow_head = wVar10;
          }
        }
      }
LAB_002a29e9:
    }
  } while( true );
}

Assistant:

void borg_flow_spread(int depth, bool optimize, bool avoid, bool tunneling,
    int stair_idx, bool sneak)
{
    int  i;
    int  n, o = 0;
    int  x1, y1;
    int  x, y;
    int  fear = 0;
    int  ii;
    int  yy, xx;
    bool bad_sneak = false;
    int  origin_y, origin_x;
    bool twitchy = false;

    /* Default starting points */
    origin_y = borg.c.y;
    origin_x = borg.c.x;

    /* Is the borg moving under boosted bravery? */
    if (avoidance > borg.trait[BI_CURHP])
        twitchy = true;

    /* Use the closest stair for calculation distance (cost) from the stair to
     * the goal */
    if (stair_idx >= 0 && borg.trait[BI_CLEVEL] < 15) {
        origin_y = track_less.y[stair_idx];
        origin_x = track_less.x[stair_idx];
        optimize = false;
    }

    /* Now process the queue */
    while (flow_head != flow_tail) {
        /* Extract the next entry */
        x1 = borg_flow_x[flow_tail];
        y1 = borg_flow_y[flow_tail];

        /* Circular queue -- dequeue the next entry */
        if (++flow_tail == AUTO_FLOW_MAX)
            flow_tail = 0;

        /* Cost (one per movement grid) */
        n = borg_data_cost->data[y1][x1] + 1;

        /* New depth */
        if (n > o) {
            /* Optimize (if requested) */
            if (optimize && (n > borg_data_cost->data[origin_y][origin_x]))
                break;

            /* Limit depth */
            if (n > depth)
                break;

            /* Save */
            o = n;
        }

        /* Queue the "children" */
        for (i = 0; i < 8; i++) {
            int old_head;

            borg_grid *ag;

            /* reset bad_sneak */
            bad_sneak = false;

            /* Neighbor grid */
            x = x1 + ddx_ddd[i];
            y = y1 + ddy_ddd[i];

            /* only on legal grids */
            if (!square_in_bounds_fully(cave, loc(x, y)))
                continue;

            /* Skip "reached" grids */
            if (borg_data_cost->data[y][x] <= n)
                continue;

            /* Access the grid */
            ag = &borg_grids[y][x];

            if (sneak && !borg_desperate && !twitchy) {
                /* Scan the neighbors */
                for (ii = 0; ii < 8; ii++) {
                    /* Neighbor grid */
                    xx = x + ddx_ddd[ii];
                    yy = y + ddy_ddd[ii];

                    /* only on legal grids */
                    if (!square_in_bounds_fully(cave, loc(xx, yy)))
                        continue;

                    /* Make sure no monster is on this grid, which is
                     * adjacent to the grid on which, I am thinking about
                     * stepping.
                     */
                    if (borg_grids[yy][xx].kill) {
                        bad_sneak = true;
                        break;
                    }
                }
            }
            /* The grid I am thinking about is adjacent to a monster */
            if (bad_sneak)
                continue;

            /* Avoid "wall" grids (not doors) unless tunneling*/
            /* HACK depends on FEAT order, kinda evil */
            if (!tunneling
                && (ag->feat >= FEAT_SECRET && ag->feat != FEAT_PASS_RUBBLE
                    && ag->feat != FEAT_LAVA))
                continue;

            /* Avoid "perma-wall" grids */
            if (ag->feat == FEAT_PERM)
                continue;

            /* Avoid "Lava" grids (for now) */
            if (ag->feat == FEAT_LAVA && !borg.trait[BI_IFIRE])
                continue;

            /* Avoid unknown grids (if requested or retreating)
             * unless twitchy.  In which case, explore it
             */
            if ((avoid || borg_desperate) && (ag->feat == FEAT_NONE)
                && !twitchy)
                continue;

            /* flowing into monsters */
            if ((ag->kill)) {
                /* Avoid if Desperate, lunal */
                if (borg_desperate || borg.lunal_mode || borg.munchkin_mode)
                    continue;

                /* Avoid if afraid */
                if (borg.trait[BI_ISAFRAID])
                    continue;

                /* Avoid if low level, unless twitchy */
                if (!twitchy && borg.trait[BI_FOOD] >= 2
                    && borg.trait[BI_MAXCLEVEL] < 5)
                    continue;
            }

            /* Avoid shop entry points if I am not heading to that shop */
            if (borg.goal.shop >= 0 && feat_is_shop(ag->feat)
                && (ag->store != borg.goal.shop) && y != borg.c.y
                && x != borg.c.x)
                continue;

            /* Avoid Traps if low level-- unless brave */
            if (ag->trap && !ag->glyph && !twitchy) {
                /* Do not disarm when you could end up dead */
                if (borg.trait[BI_CURHP] < 60)
                    continue;

                /* Do not disarm when clumsy */
                /* since traps can be physical or magical, gotta check both */
                if (borg.trait[BI_DISP] < 30 && borg.trait[BI_CLEVEL] < 20)
                    continue;
                if (borg.trait[BI_DISP] < 45 && borg.trait[BI_CLEVEL] < 10)
                    continue;
                if (borg.trait[BI_DISM] < 30 && borg.trait[BI_CLEVEL] < 20)
                    continue;
                if (borg.trait[BI_DISM] < 45 && borg.trait[BI_CLEVEL] < 10)
                    continue;

                /* NOTE:  Traps are tough to deal with as a low
                 * level character.  If any modifications are made above,
                 * then the same changes must be made to borg_flow_direct()
                 * and borg_flow_interesting()
                 */
            }

            /* Ignore "icky" grids */
            if (borg_data_icky->data[y][x])
                continue;

            /* Analyze every grid once */
            if (!borg_data_know->data[y][x]) {
                int p;

                /* Mark as known */
                borg_data_know->data[y][x] = true;

                if (!borg_desperate && !borg.lunal_mode && !borg.munchkin_mode
                    && !borg_digging) {
                    /* Get the danger */
                    p = borg_danger(y, x, 1, true, false);

                    /* Increase bravery */
                    if (borg.trait[BI_MAXCLEVEL] == 50)
                        fear = avoidance * 5 / 10;
                    if (borg.trait[BI_MAXCLEVEL] != 50)
                        fear = avoidance * 3 / 10;
                    if (scaryguy_on_level)
                        fear = avoidance * 2;
                    if (unique_on_level && vault_on_level
                        && borg.trait[BI_MAXCLEVEL] == 50)
                        fear = avoidance * 3;
                    if (scaryguy_on_level && borg.trait[BI_CLEVEL] <= 5)
                        fear = avoidance * 3;
                    if (borg.goal.ignoring)
                        fear = avoidance * 5;
                    if (borg_t - borg_began > 5000)
                        fear = avoidance * 25;
                    if (borg.trait[BI_FOOD] == 0)
                        fear = avoidance * 100;

                    /* Normal in town */
                    if (borg.trait[BI_CLEVEL] == 0)
                        fear = avoidance * 3 / 10;

                    /* Dangerous grid */
                    if (p > fear) {
                        /* Mark as icky */
                        borg_data_icky->data[y][x] = true;

                        /* Ignore this grid */
                        continue;
                    }
                }
            }

            /* Save the flow cost */
            borg_data_cost->data[y][x] = n;

            /* Enqueue that entry */
            borg_flow_x[flow_head] = x;
            borg_flow_y[flow_head] = y;

            /* Circular queue -- memorize head */
            old_head = flow_head;

            /* Circular queue -- insert with wrap */
            if (++flow_head == AUTO_FLOW_MAX)
                flow_head = 0;

            /* Circular queue -- handle overflow (badly) */
            if (flow_head == flow_tail)
                flow_head = old_head;
        }
    }

    /* Forget the flow info */
    flow_head = flow_tail = 0;
}